

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

bool __thiscall
minihttp::HttpSocket::SendRequest(HttpSocket *this,string *what,char *extraRequest,void *user)

{
  bool bVar1;
  Request req;
  Request RStack_e8;
  
  Request::Request(&RStack_e8,what,&(this->super_TcpSocket)._host,(this->super_TcpSocket)._lastport,
                   user);
  if (extraRequest != (char *)0x0) {
    std::__cxx11::string::assign((char *)&RStack_e8.extraGetHeaders);
  }
  bVar1 = SendRequest(this,&RStack_e8,false);
  Request::~Request(&RStack_e8);
  return bVar1;
}

Assistant:

bool HttpSocket::SendRequest(const std::string& what, const char *extraRequest /*= NULL*/, void *user /* = NULL */)
{
    Request req(what, _host, _lastport, user);
    if(extraRequest)
        req.extraGetHeaders = extraRequest;
    return SendRequest(req, false);
}